

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O2

Vec_Int_t * Mio_SopVar1(int i)

{
  Vec_Int_t *p;
  
  p = Vec_IntAlloc(1);
  Vec_IntPush(p,2 << ((char)i * '\x02' & 0x1fU));
  return p;
}

Assistant:

Vec_Int_t * Mio_SopVar1( int i )
{
    Vec_Int_t * vSop;
    vSop = Vec_IntAlloc( 1 );
    Vec_IntPush( vSop, Mio_CubeVar1(i) );
    return vSop;
}